

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O3

uint32_t slang::clog2(SVInt *v)

{
  bitwidth_t bVar1;
  long lVar2;
  ulong uVar3;
  logic_t lVar4;
  uint uVar5;
  uint32_t uVar6;
  bitwidth_t bVar7;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_30;
  uint uStack_28;
  undefined1 uStack_24;
  byte bStack_23;
  
  bStack_23 = 0;
  local_30.val._0_6_ = 0;
  local_30.val._6_2_ = 0;
  uStack_24 = 1;
  uStack_28 = 1;
  SVInt::clearUnusedBits((SVInt *)&local_30);
  lVar4 = SVInt::operator==(v,(SVInt *)&local_30);
  if (((0x40 < uStack_28) || ((bStack_23 & 1) != 0)) &&
     ((void *)CONCAT26(local_30.val._6_2_,local_30.val._0_6_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT26(local_30.val._6_2_,local_30.val._0_6_));
  }
  uVar6 = 0;
  if ((lVar4.value == '\0' || lVar4.value == 0x80) || lVar4.value == '@') {
    bVar1 = (v->super_SVIntStorage).bitWidth;
    SVInt::operator-((SVInt *)&local_30,v);
    if ((uStack_28 < 0x41) && ((bStack_23 & 1) == 0)) {
      uVar3 = CONCAT26(local_30.val._6_2_,local_30.val._0_6_);
      if (uVar3 == 0) {
        uVar5 = 0x40;
      }
      else {
        lVar2 = 0x3f;
        if (uVar3 != 0) {
          for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar5 = (uint)lVar2 ^ 0x3f;
      }
      bVar7 = (uStack_28 + uVar5) - 0x40;
    }
    else {
      bVar7 = SVInt::countLeadingZerosSlowCase((SVInt *)&local_30);
      if (((0x40 < uStack_28) || ((bStack_23 & 1) != 0)) &&
         ((void *)CONCAT26(local_30.val._6_2_,local_30.val._0_6_) != (void *)0x0)) {
        operator_delete__((void *)CONCAT26(local_30.val._6_2_,local_30.val._0_6_));
      }
    }
    uVar6 = bVar1 - bVar7;
  }
  return uVar6;
}

Assistant:

inline SLANG_EXPORT uint32_t clog2(const SVInt& v) {
    if (v == 0)
        return 0;
    return v.getBitWidth() - (v - SVInt::One).countLeadingZeros();
}